

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall DISTRHO::String::String(String *this,uint value,bool hexadecimal)

{
  char *pcVar1;
  char local_118 [8];
  char strBuf [256];
  bool hexadecimal_local;
  uint value_local;
  String *this_local;
  
  strBuf[0xfb] = hexadecimal;
  strBuf._252_4_ = value;
  pcVar1 = _null();
  this->fBuffer = pcVar1;
  this->fBufferLen = 0;
  this->fBufferAlloc = false;
  pcVar1 = "%u";
  if ((strBuf[0xfb] & 1U) != 0) {
    pcVar1 = "0x%x";
  }
  snprintf(local_118,0xff,pcVar1,(ulong)(uint)strBuf._252_4_);
  strBuf[0xf7] = '\0';
  _dup(this,(int)local_118);
  return;
}

Assistant:

explicit String(const unsigned int value, const bool hexadecimal = false) noexcept
        : fBuffer(_null()),
          fBufferLen(0),
          fBufferAlloc(false)
    {
        char strBuf[0xff+1];
        std::snprintf(strBuf, 0xff, hexadecimal ? "0x%x" : "%u", value);
        strBuf[0xff] = '\0';

        _dup(strBuf);
    }